

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_soundex(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uchar uVar1;
  int iVar2;
  undefined8 in_RAX;
  byte *pbVar3;
  ushort **ppuVar4;
  __int32_t **pp_Var5;
  uchar uVar6;
  long lVar7;
  char *zString;
  jx9_value *pVal;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  char zResult [8];
  undefined8 local_38;
  
  zString = (char *)&local_38;
  local_38 = in_RAX;
  if (nArg < 1) {
    pVal = pCtx->pRet;
    zString = "";
    iVar2 = 0;
  }
  else {
    uVar10 = 0;
    pbVar3 = (byte *)jx9_value_to_string(*apArg,(int *)0x0);
    bVar8 = *pbVar3;
    if ((byte)(bVar8 - 1) < 0xbf) {
      ppuVar4 = __ctype_b_loc();
      uVar10 = 0;
      do {
        uVar9 = (ulong)bVar8;
        if ((*(byte *)((long)*ppuVar4 + uVar9 * 2 + 1) & 4) != 0) goto LAB_001320b9;
        bVar8 = pbVar3[uVar10 + 1];
        uVar10 = uVar10 + 1;
      } while ((byte)(bVar8 - 1) < 0xbf);
    }
    if (bVar8 == 0) {
      pVal = pCtx->pRet;
      zString = "?000";
    }
    else {
      uVar9 = (ulong)bVar8;
LAB_001320b9:
      uVar6 = ""[bVar8 & 0x7f];
      pp_Var5 = __ctype_toupper_loc();
      local_38 = CONCAT71(local_38._1_7_,(char)(*pp_Var5)[uVar9]);
      pbVar3 = pbVar3 + (uVar10 & 0xffffffff);
      iVar2 = 1;
      do {
        if (*pbVar3 == 0) {
          memset((void *)((long)&local_38 + (long)iVar2),0x30,(ulong)(3 - iVar2) + 1);
          break;
        }
        uVar1 = ""[*pbVar3 & 0x7f];
        if (uVar1 == '\0') {
          uVar6 = '\0';
        }
        else if (uVar1 != uVar6) {
          lVar7 = (long)iVar2;
          iVar2 = iVar2 + 1;
          *(uchar *)((long)&local_38 + lVar7) = uVar1 + '0';
          uVar6 = uVar1;
        }
        pbVar3 = pbVar3 + 1;
      } while (iVar2 < 4);
      pVal = pCtx->pRet;
    }
    iVar2 = 4;
  }
  jx9_value_string(pVal,zString,iVar2);
  return 0;
}

Assistant:

static int jx9Builtin_soundex(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn;
	char zResult[8];
	int i, j;
	static const unsigned char iCode[] = {
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 1, 2, 3, 0, 1, 2, 0, 0, 2, 2, 4, 5, 5, 0, 
		1, 2, 6, 2, 3, 0, 1, 0, 2, 0, 2, 0, 0, 0, 0, 0, 
		0, 0, 1, 2, 3, 0, 1, 2, 0, 0, 2, 2, 4, 5, 5, 0, 
		1, 2, 6, 2, 3, 0, 1, 0, 2, 0, 2, 0, 0, 0, 0, 0, 
	};
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	zIn = (unsigned char *)jx9_value_to_string(apArg[0], 0);
	for(i=0; zIn[i] && zIn[i] < 0xc0 && !SyisAlpha(zIn[i]); i++){}
	if( zIn[i] ){
		unsigned char prevcode = iCode[zIn[i]&0x7f];
		zResult[0] = (char)SyToUpper(zIn[i]);
		for(j=1; j<4 && zIn[i]; i++){
			int code = iCode[zIn[i]&0x7f];
			if( code>0 ){
				if( code!=prevcode ){
					prevcode = (unsigned char)code;
					zResult[j++] = (char)code + '0';
				}
			}else{
				prevcode = 0;
			}
		}
		while( j<4 ){
			zResult[j++] = '0';
		}
		jx9_result_string(pCtx, zResult, 4);
	}else{
	  jx9_result_string(pCtx, "?000", 4);
	}
	return JX9_OK;
}